

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O3

TPZHierarquicalGrid * __thiscall
TPZHierarquicalGrid::operator=(TPZHierarquicalGrid *this,TPZHierarquicalGrid *other)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  
  std::__cxx11::string::_M_assign((string *)&this->fFileName);
  bVar1 = other->fIsQuad;
  bVar2 = other->fIsPrism;
  bVar3 = other->fIsTetrahedron;
  this->fNonAffineQ = other->fNonAffineQ;
  this->fIsQuad = bVar1;
  this->fIsPrism = bVar2;
  this->fIsTetrahedron = bVar3;
  this->fComputedGeomesh = other->fComputedGeomesh;
  iVar4 = other->fbackMatID;
  this->ffrontMatID = other->ffrontMatID;
  this->fbackMatID = iVar4;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::operator=(&this->fSubBases,&other->fSubBases);
  TPZAutoPointer<TPZGeoMesh>::operator=(&this->fBase,&other->fBase);
  return this;
}

Assistant:

TPZHierarquicalGrid& TPZHierarquicalGrid::operator=(const TPZHierarquicalGrid& other)
{
    fFileName   = other.fFileName;
    fNonAffineQ = other.fNonAffineQ;
    fIsQuad = other.fIsQuad;
    fIsPrism = other.fIsPrism;
    fIsTetrahedron = other.fIsTetrahedron;
    fComputedGeomesh = other.fComputedGeomesh;
    ffrontMatID = other.ffrontMatID;
    fbackMatID = other.fbackMatID;
    fSubBases = other.fSubBases;
    fBase = other.fBase;
    return *this;
}